

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vacuum.cpp
# Opt level: O1

Expression * __thiscall
wasm::Vacuum::optimize(Vacuum *this,Expression *curr,bool resultUsed,bool typeMatters)

{
  PassRunner *pPVar1;
  bool bVar2;
  Index IVar3;
  long lVar4;
  Expression *pEVar5;
  undefined8 *puVar6;
  Expression *ast;
  Index index;
  Expression *unaff_R13;
  Expression *pEVar7;
  Index IVar8;
  byte bVar9;
  bool bVar10;
  EffectAnalyzer local_418;
  Literals local_2a8;
  undefined1 local_270 [8];
  EffectAnalyzer self;
  undefined8 local_f8 [4];
  void *local_d8;
  long local_d0;
  long local_c8;
  Expression *local_c0;
  Expression *child;
  bool *local_b0;
  size_t *local_a8;
  size_t *local_a0;
  Expression *local_98;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  *local_90;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  *local_88;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  *local_80;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  *local_78;
  undefined1 local_70 [8];
  SmallVector<wasm::Expression_*,_1UL> childrenWithEffects;
  
  childrenWithEffects.flexible.
  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(curr->type).id;
  bVar10 = childrenWithEffects.flexible.
           super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage == (pointer)0x0;
  if (childrenWithEffects.flexible.
      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x1) {
    if (resultUsed) {
      if (childrenWithEffects.flexible.
          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
        __assert_fail("!resultUsed || curr->type != Type::none",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Vacuum.cpp"
                      ,0x60,"Expression *wasm::Vacuum::optimize(Expression *, bool, bool)");
      }
      if (resultUsed) {
        return curr;
      }
    }
    local_90 = &local_418.delegateTargets._M_t;
    local_88 = &local_418.breakTargets._M_t;
    local_80 = &local_418.globalsWritten._M_t;
    local_78 = &local_418.mutableGlobalsRead._M_t;
    child = (Expression *)&self.breakTargets._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_b0 = &self.danglingPop;
    local_a8 = &self.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_a0 = &self.localsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count;
    pEVar7 = curr;
    pEVar5 = curr;
    do {
      ast = pEVar7;
      if ((bVar10 || typeMatters) &&
         ((pointer)(ast->type).id !=
          childrenWithEffects.flexible.
          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage)) {
        return pEVar5;
      }
      if (((ulong)ast->_id < 0x32) && ((0x200000004000eU >> ((ulong)ast->_id & 0x3f) & 1) != 0)) {
        return ast;
      }
      pPVar1 = (this->
               super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
               ).super_Pass.runner;
      self.funcEffectsMap.
      super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (this->
           super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
           ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.
           super_PostWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.
           super_Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.currModule;
      local_270[0] = (pPVar1->options).ignoreImplicitTraps;
      local_270[1] = (pPVar1->options).trapsNeverHappen;
      self._0_8_ = (pPVar1->options).funcEffectsMap.
                   super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
      self.funcEffectsMap.
      super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)
                (pPVar1->options).funcEffectsMap.
                super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          self.funcEffectsMap.
          super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          self.funcEffectsMap.
          super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               self.funcEffectsMap.
               super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          self.funcEffectsMap.
          super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               self.funcEffectsMap.
               super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->_M_use_count + 1;
        }
      }
      self.module._0_4_ =
           (((Module *)
            self.funcEffectsMap.
            super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->features).features;
      self.module._4_2_ = 0;
      self.localsRead._M_t._M_impl._0_4_ = 0;
      self.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      self.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      self.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)&self.localsRead;
      self.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      self.localsWritten._M_t._M_impl._0_4_ = 0;
      self.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      self.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      self.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)&self.localsWritten;
      self.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      self.mutableGlobalsRead._M_t._M_impl._0_4_ = 0;
      self.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      self.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      self.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)&self.mutableGlobalsRead;
      self.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0
      ;
      self.globalsWritten._M_t._M_impl._0_4_ = 0;
      self.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      self.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      self.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)&self.globalsWritten;
      self.breakTargets._M_t._M_impl._0_4_ = 0;
      self.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      self.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      self.readsMemory = false;
      self.writesMemory = false;
      self.readsTable = false;
      self.writesTable = false;
      self.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      self.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      self.trap = false;
      self.implicitTrap = false;
      self.isAtomic = false;
      self.throws_ = false;
      self._244_4_ = 0;
      self.tryDepth = 0;
      self.catchDepth._0_1_ = '\0';
      self.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)&self.breakTargets;
      self.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      self.delegateTargets._M_t._M_impl._0_4_ = 0;
      self.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      self.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      self.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)&self.delegateTargets;
      self.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      self.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           self.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      self.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           self.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      self.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           self.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      self.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           self.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      self.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           self.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      self.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           self.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      EffectAnalyzer::visit((EffectAnalyzer *)local_270,ast);
      pEVar7 = ast;
      pEVar5 = ast;
      if ((self.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right !=
           (_Base_ptr)0x0) || (bVar2 = false, (char)self.catchDepth != '\0')) goto LAB_00941e97;
      local_98 = unaff_R13;
      if (self.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right !=
          (_Base_ptr)0x0) goto LAB_00941e9d;
      if ((((self.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count._1_1_ == '\0') &&
           (self.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ == '\0')) &&
          (self.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_ == '\0')) &&
         (((self.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ == '\0' &&
           (self.readsTable == false)) && (self.module._5_1_ == '\0')))) {
        bVar2 = false;
        if (self.writesTable != false) goto LAB_00941e97;
        if (self.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right ==
            (_Base_ptr)0x0) {
          bVar2 = false;
          if (self.module._4_1_ != '\0') goto LAB_00941e97;
          if (self.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right ==
              (_Base_ptr)0x0) {
            if ((self.readsMemory == true) && ((local_270[1] & 1U) == 0)) goto LAB_00941e97;
            local_70 = (undefined1  [8])0x0;
            childrenWithEffects.flexible.
            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            childrenWithEffects.fixed._M_elems[0] = (_Type)(Expression *)0x0;
            childrenWithEffects.flexible.
            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator
                      ((AbstractChildIterator<wasm::ChildIterator> *)
                       &self.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count,ast);
            IVar8 = (int)((ulong)(local_d0 - (long)local_d8) >> 3) +
                    (int)self.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count;
            if (IVar8 != 0) {
              index = 0;
              do {
                IVar3 = AbstractChildIterator<wasm::ChildIterator>::mapIndex
                                  ((AbstractChildIterator<wasm::ChildIterator> *)
                                   &self.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                                    _M_node_count,index);
                puVar6 = (undefined8 *)((long)local_d8 + (ulong)IVar3 * 8 + -0x20);
                if (IVar3 < 4) {
                  puVar6 = local_f8 + IVar3;
                }
                local_c0 = *(Expression **)*puVar6;
                EffectAnalyzer::EffectAnalyzer
                          (&local_418,
                           &((this->
                             super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                             ).super_Pass.runner)->options,
                           (this->
                           super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                           ).
                           super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                           .super_PostWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.
                           super_Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.currModule
                           ,local_c0);
                bVar9 = 1;
                if ((((local_418.localsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count == 0
                      ) && (local_418.danglingPop == false)) &&
                    (local_418.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)
                    ) && ((((local_418.writesMemory == false && (local_418.writesTable == false)) &&
                           (((local_418.writesStruct == false &&
                             ((local_418.writesArray == false && (local_418.isAtomic == false)))) &&
                            (local_418.calls == false)))) &&
                          ((((local_418.throws_ == false &&
                             (local_418.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                              _M_node_count == 0)) && (local_418.branchesOut == false)) &&
                           (local_418.breakTargets._M_t._M_impl.super__Rb_tree_header._M_node_count
                            == 0)))))) {
                  if (local_418.trap == true) {
                    bVar9 = local_418.trapsNeverHappen ^ 1;
                  }
                  else {
                    bVar9 = 0;
                  }
                }
                std::
                _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                ::~_Rb_tree(local_90);
                std::
                _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                ::~_Rb_tree(local_88);
                std::
                _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                ::~_Rb_tree(local_80);
                std::
                _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                ::~_Rb_tree(local_78);
                std::
                _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                ::~_Rb_tree(&local_418.localsWritten._M_t);
                std::
                _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                ::~_Rb_tree(&local_418.localsRead._M_t);
                if (local_418.funcEffectsMap.
                    super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_418.funcEffectsMap.
                             super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi);
                }
                if (bVar9 != 0) {
                  SmallVector<wasm::Expression_*,_1UL>::push_back
                            ((SmallVector<wasm::Expression_*,_1UL> *)local_70,&local_c0);
                }
                index = index + 1;
              } while (IVar8 != index);
            }
            if (local_d8 != (void *)0x0) {
              operator_delete(local_d8,local_c8 - (long)local_d8);
            }
            lVar4 = ((long)childrenWithEffects.flexible.
                           super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                           ._M_impl.super__Vector_impl_data._M_start -
                     (long)childrenWithEffects.fixed._M_elems[0] >> 3) + (long)local_70;
            if (lVar4 == 0) {
              bVar2 = false;
              pEVar5 = (Expression *)0x0;
            }
            else if (lVar4 == 1) {
              bVar2 = true;
              pEVar7 = (Expression *)childrenWithEffects.usedFixed;
              pEVar5 = local_98;
            }
            else {
              bVar2 = wasm::Type::isDefaultable(&ast->type);
              if (bVar2) {
                local_418._0_8_ =
                     (this->
                     super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                     ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                     .super_PostWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.
                     super_Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.currModule;
                Literal::makeZeros(&local_2a8,(Type)(ast->type).id);
                pEVar5 = Builder::makeConstantExpression((Builder *)&local_418,&local_2a8);
                std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                          (&local_2a8.super_SmallVector<wasm::Literal,_1UL>.flexible);
                Literal::~Literal(local_2a8.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems);
                pEVar5 = getDroppedChildrenAndAppend
                                   (ast,(this->
                                        super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                                        ).
                                        super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                                        .
                                        super_PostWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                                        .
                                        super_Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                                        .currModule,
                                    &((this->
                                      super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                                      ).super_Pass.runner)->options,pEVar5);
                bVar2 = false;
              }
              else {
                bVar2 = false;
              }
            }
            if (childrenWithEffects.fixed._M_elems[0] != (Expression *)0x0) {
              operator_delete((void *)childrenWithEffects.fixed._M_elems[0],
                              (long)childrenWithEffects.flexible.
                                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)childrenWithEffects.fixed._M_elems[0]);
            }
          }
        }
      }
      else {
LAB_00941e97:
        bVar2 = false;
      }
LAB_00941e9d:
      unaff_R13 = pEVar5;
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)child);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)local_b0);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)local_a8);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)local_a0);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&self.localsRead._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&self.features);
      if (self.funcEffectsMap.
          super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   self.funcEffectsMap.
                   super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
      }
      pEVar5 = ast;
      curr = unaff_R13;
    } while (bVar2);
  }
  return curr;
}

Assistant:

Expression* optimize(Expression* curr, bool resultUsed, bool typeMatters) {
    auto type = curr->type;
    // If the type is none, then we can never replace it with another type.
    if (type == Type::none) {
      typeMatters = true;
    }
    // An unreachable node must not be changed. DCE will remove those.
    if (type == Type::unreachable) {
      return curr;
    }
    // resultUsed only makes sense when the type is concrete
    assert(!resultUsed || curr->type != Type::none);
    // If we actually need the result, then we must not change anything.
    // TODO: maybe there is something clever though?
    if (resultUsed) {
      return curr;
    }
    // We iterate on possible replacements.
    auto* prev = curr;
    while (1) {
      // If a replacement changes the type, and the type matters, return the
      // previous one and stop.
      if (typeMatters && curr->type != type) {
        return prev;
      }
      prev = curr;
      // Some instructions have special handling in visit*, and we should do
      // nothing for them here.
      if (curr->is<Drop>() || curr->is<Block>() || curr->is<If>() ||
          curr->is<Loop>() || curr->is<Try>()) {
        return curr;
      }
      // Check if this expression itself has side effects, ignoring children.
      EffectAnalyzer self(getPassOptions(), *getModule());
      self.visit(curr);
      if (self.hasUnremovableSideEffects()) {
        return curr;
      }
      // The result isn't used, and this has no side effects itself, so we can
      // get rid of it. However, the children may have side effects.
      SmallVector<Expression*, 1> childrenWithEffects;
      for (auto* child : ChildIterator(curr)) {
        if (EffectAnalyzer(getPassOptions(), *getModule(), child)
              .hasUnremovableSideEffects()) {
          childrenWithEffects.push_back(child);
        }
      }
      if (childrenWithEffects.empty()) {
        return nullptr;
      }
      if (childrenWithEffects.size() == 1) {
        // We know the result isn't used, and curr has no side effects, so we
        // can skip curr and keep looking into the child.
        curr = childrenWithEffects[0];
        continue;
      }
      // The result is not used, but multiple children have side effects, so we
      // need to keep them around. We must also return something of the proper
      // type - if we can do that, replace everything with the children + a
      // dummy value of the proper type.
      if (curr->type.isDefaultable()) {
        auto* dummy = Builder(*getModule())
                        .makeConstantExpression(Literal::makeZeros(curr->type));
        return getDroppedChildrenAndAppend(
          curr, *getModule(), getPassOptions(), dummy);
      }
      // Otherwise, give up.
      return curr;
    }
  }